

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

time_t __thiscall ON_XMLVariant::AsTime(ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  wchar_t *s;
  double dVar7;
  tm local_68;
  
  pOVar1 = this->_private;
  if (pOVar1->_type == Time) {
    dVar7 = (pOVar1->field_2)._double_val;
  }
  else if (pOVar1->_type == String) {
    iVar2 = ON_wString::Length(&pOVar1->_string_val);
    dVar7 = -NAN;
    if (iVar2 == 0x13) {
      s = ON_wString::operator_cast_to_wchar_t_(&pOVar1->_string_val);
      if ((((s[4] == L'.') && (s[7] == L'.')) && (s[10] == L'_')) &&
         ((s[0xd] == L':' && (s[0x10] == L':')))) {
        iVar2 = ON_wtoi(s);
        iVar3 = ON_wtoi(s + 5);
        iVar4 = ON_wtoi(s + 8);
        uVar5 = ON_wtoi(s + 0xb);
        uVar6 = ON_wtoi(s + 0xe);
        local_68.tm_sec = ON_wtoi(s + 0x11);
        if ((((0xfffffff3 < iVar3 - 0xdU && 0xfffffda6 < iVar2 - 0x9c5U) &&
             ((iVar4 - 1U < 0x1f && (uVar5 < 0x18)))) && (uVar6 < 0x3c)) &&
           ((uint)local_68.tm_sec < 0x3c)) {
          local_68.tm_wday = 0;
          local_68.tm_yday = 0;
          local_68.tm_gmtoff = 0;
          local_68.tm_zone = (char *)0x0;
          local_68.tm_year = iVar2 + -0x76c;
          local_68.tm_mon = iVar3 + -1;
          local_68.tm_isdst = -1;
          local_68._36_4_ = 0;
          local_68.tm_min = uVar6;
          local_68.tm_hour = uVar5;
          local_68.tm_mday = iVar4;
          dVar7 = (double)mktime(&local_68);
        }
      }
    }
  }
  else {
    dVar7 = 0.0;
  }
  return (time_t)dVar7;
}

Assistant:

time_t ON_XMLVariant::AsTime(void) const
{
  switch (_private->_type)
  {
  case Types::String:
    return TimeFromString(_private->_string_val);

  case Types::Time:
    return _private->_time_val;
          
  default: return 0;
  }
}